

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TerragenLoader.cpp
# Opt level: O2

void __thiscall
Assimp::TerragenImporter::InternReadFile
          (TerragenImporter *this,string *pFile,aiScene *pScene,IOSystem *pIOHandler)

{
  char *pcVar1;
  long lVar2;
  char cVar3;
  short sVar4;
  short sVar5;
  ushort uVar6;
  int iVar7;
  undefined4 extraout_var;
  aiNode *this_00;
  aiMesh **ppaVar8;
  aiMesh *this_01;
  ulong *puVar9;
  aiVector3D *__s;
  aiVector3D *__s_00;
  Logger *this_02;
  ulong uVar10;
  uint *puVar11;
  long lVar12;
  DeadlyImportError *pDVar13;
  aiFace *paVar14;
  ulong uVar15;
  uint xx;
  ulong uVar16;
  aiFace *paVar17;
  ulong uVar18;
  uint uVar19;
  uint uVar20;
  float fVar21;
  float fVar22;
  allocator local_11d;
  float local_11c;
  ulong local_118;
  ulong local_110;
  float local_108;
  float local_104;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_100;
  ulong local_e0;
  float local_d8;
  float local_d4;
  float local_d0;
  float local_cc;
  TerragenImporter *local_c8;
  StreamReaderLE reader;
  
  local_c8 = this;
  std::__cxx11::string::string((string *)&reader,"rb",(allocator *)&local_100);
  iVar7 = (*pIOHandler->_vptr_IOSystem[4])
                    (pIOHandler,(pFile->_M_dataplus)._M_p,
                     reader.stream.super___shared_ptr<Assimp::IOStream,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr);
  std::__cxx11::string::~string((string *)&reader);
  if ((IOStream *)CONCAT44(extraout_var,iVar7) == (IOStream *)0x0) {
    pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::operator+(&local_100,"Failed to open TERRAGEN TERRAIN file ",pFile);
    std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)&reader,
                   &local_100,".");
    DeadlyImportError::DeadlyImportError(pDVar13,(string *)&reader);
    __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  StreamReader<false,_false>::StreamReader(&reader,(IOStream *)CONCAT44(extraout_var,iVar7),false);
  pcVar1 = (char *)CONCAT44(reader.current._4_4_,(int)reader.current);
  if (((int)reader.end - (int)reader.current & 0xfffffff0U) == 0) {
    pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_100,"TER: file is too small",&local_11d);
    DeadlyImportError::DeadlyImportError(pDVar13,&local_100);
    __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar7 = strncmp(pcVar1,"TERRAGEN",8);
  if (iVar7 != 0) {
    pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_100,"TER: Magic string \'TERRAGEN\' not found",&local_11d);
    DeadlyImportError::DeadlyImportError(pDVar13,&local_100);
    __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  iVar7 = strncmp(pcVar1 + 8,"TERRAIN ",8);
  if (iVar7 != 0) {
    pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string
              ((string *)&local_100,"TER: Magic string \'TERRAIN\' not found",&local_11d);
    DeadlyImportError::DeadlyImportError(pDVar13,&local_100);
    __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  this_00 = (aiNode *)operator_new(0x478);
  aiNode::aiNode(this_00);
  pScene->mRootNode = this_00;
  aiString::Set((aiString *)this_00,"<TERRAGEN.TERRAIN>");
  (this_00->mTransformation).c3 = 30.0;
  (this_00->mTransformation).b2 = 30.0;
  (this_00->mTransformation).a1 = 30.0;
  StreamReader<false,_false>::IncPtr(&reader,0x10);
  local_118 = 0;
  local_110 = 0;
  while( true ) {
    pcVar1 = (char *)CONCAT44(reader.current._4_4_,(int)reader.current);
    if (((int)reader.end - (int)reader.current & 0xfffffffcU) == 0) break;
    StreamReader<false,_false>::IncPtr(&reader,4);
    iVar7 = strncmp(pcVar1,"EOF ",4);
    if (iVar7 == 0) break;
    iVar7 = strncmp(pcVar1,"XPTS",4);
    if (iVar7 == 0) {
      uVar6 = StreamReader<false,_false>::Get<short>(&reader);
      local_110 = (ulong)uVar6;
    }
    else {
      iVar7 = strncmp(pcVar1,"YPTS",4);
      if (iVar7 == 0) {
        uVar6 = StreamReader<false,_false>::Get<short>(&reader);
        local_118 = (ulong)uVar6;
      }
      else {
        iVar7 = strncmp(pcVar1,"SIZE",4);
        if (iVar7 == 0) {
          uVar6 = StreamReader<false,_false>::Get<short>(&reader);
          local_118 = (ulong)(uVar6 + 1);
          local_110 = local_118;
        }
        else {
          iVar7 = strncmp(pcVar1,"SCAL",4);
          if (iVar7 == 0) {
            fVar21 = StreamReader<false,_false>::Get<float>(&reader);
            (this_00->mTransformation).a1 = fVar21;
            fVar21 = StreamReader<false,_false>::Get<float>(&reader);
            (this_00->mTransformation).b2 = fVar21;
            fVar21 = StreamReader<false,_false>::Get<float>(&reader);
            (this_00->mTransformation).c3 = fVar21;
          }
          else {
            iVar7 = strncmp(pcVar1,"CRAD",4);
            if (iVar7 == 0) {
              StreamReader<false,_false>::Get<float>(&reader);
            }
            else {
              iVar7 = strncmp(pcVar1,"CRVM",4);
              if (iVar7 == 0) {
                cVar3 = StreamReader<false,_false>::Get<signed_char>(&reader);
                if (cVar3 != '\0') {
                  this_02 = DefaultLogger::get();
                  Logger::error(this_02,"TER: Unsupported mapping mode, a flat terrain is returned")
                  ;
                }
              }
              else {
                iVar7 = strncmp(pcVar1,"ALTW",4);
                if (iVar7 == 0) {
                  sVar4 = StreamReader<false,_false>::Get<short>(&reader);
                  sVar5 = StreamReader<false,_false>::Get<short>(&reader);
                  uVar19 = (uint)local_110;
                  if ((uint)((int)reader.end - (int)reader.current) < (uint)local_118 * uVar19 * 2)
                  {
                    pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                    std::__cxx11::string::string
                              ((string *)&local_100,"TER: ALTW chunk is too small",&local_11d);
                    DeadlyImportError::DeadlyImportError(pDVar13,&local_100);
                    __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  if ((uVar19 < 2) || ((uint)local_118 < 2)) {
                    pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
                    std::__cxx11::string::string
                              ((string *)&local_100,"TER: Invalid terrain size",&local_11d);
                    DeadlyImportError::DeadlyImportError(pDVar13,&local_100);
                    __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,
                                std::runtime_error::~runtime_error);
                  }
                  pScene->mNumMeshes = 1;
                  ppaVar8 = (aiMesh **)operator_new__(8);
                  pScene->mMeshes = ppaVar8;
                  this_01 = (aiMesh *)operator_new(0x520);
                  aiMesh::aiMesh(this_01);
                  *pScene->mMeshes = this_01;
                  local_11c = (float)(uVar19 - 1);
                  iVar7 = (int)local_118 + -1;
                  local_e0 = CONCAT44(local_e0._4_4_,iVar7);
                  uVar19 = (int)local_11c * iVar7;
                  uVar18 = (ulong)uVar19;
                  this_01->mNumFaces = uVar19;
                  puVar9 = (ulong *)operator_new__(uVar18 * 0x10 + 8);
                  local_d0 = (float)(int)sVar5;
                  uVar20 = -(uint)((float)(int)sVar4 * 1.5258789e-05 != 0.0);
                  fVar21 = (float)(~uVar20 & 0x3f800000 |
                                  (uint)((float)(int)sVar4 * 1.5258789e-05) & uVar20);
                  *puVar9 = uVar18;
                  paVar17 = (aiFace *)(puVar9 + 1);
                  paVar14 = paVar17;
                  do {
                    paVar14->mNumIndices = 0;
                    paVar14->mIndices = (uint *)0x0;
                    paVar14 = paVar14 + 1;
                  } while (paVar14 != (aiFace *)(puVar9 + uVar18 * 2 + 1));
                  this_01->mFaces = paVar17;
                  uVar20 = uVar19 * 4;
                  this_01->mNumVertices = uVar20;
                  uVar18 = (ulong)uVar20 * 0xc;
                  __s = (aiVector3D *)operator_new__(uVar18);
                  if ((uVar19 & 0x3fffffff) != 0) {
                    memset(__s,0,((uVar18 - 0xc) - (uVar18 - 0xc) % 0xc) + 0xc);
                  }
                  this_01->mVertices = __s;
                  if (local_c8->configComputeUVs == true) {
                    __s_00 = (aiVector3D *)operator_new__(uVar18);
                    if (uVar20 != 0) {
                      memset(__s_00,0,((uVar18 - 0xc) - (uVar18 - 0xc) % 0xc) + 0xc);
                    }
                    this_01->mTextureCoords[0] = __s_00;
                    uVar19 = (uint)local_110;
                    local_108 = 1.0 / (float)(int)local_118;
                    local_104 = 1.0 / (float)(int)uVar19;
                  }
                  else {
                    local_108 = 0.0;
                    __s_00 = (aiVector3D *)0x0;
                    local_104 = 0.0;
                    uVar19 = (uint)local_110;
                  }
                  lVar2 = CONCAT44(reader.current._4_4_,(int)reader.current);
                  uVar18 = local_e0 & 0xffffffff;
                  uVar10 = (ulong)(uint)local_11c;
                  uVar15 = 0;
                  iVar7 = 0;
                  while (uVar15 != uVar18) {
                    local_11c = (float)(int)uVar15;
                    local_e0 = uVar15 * uVar19;
                    local_cc = local_11c + 1.0;
                    uVar15 = uVar15 + 1;
                    local_d8 = local_108 * local_11c;
                    local_d4 = (float)(int)uVar15 * local_108;
                    for (uVar16 = 0; uVar16 != uVar10; uVar16 = uVar16 + 1) {
                      fVar22 = (float)(int)uVar16;
                      sVar4 = *(short *)(lVar2 + (local_e0 + uVar16) * 2);
                      __s->x = fVar22;
                      __s->y = local_11c;
                      __s->z = (float)(int)sVar4 * fVar21 + local_d0;
                      lVar12 = uVar16 + uVar15 * uVar19;
                      sVar4 = *(short *)(lVar2 + lVar12 * 2);
                      __s[1].x = fVar22;
                      __s[1].y = local_cc;
                      __s[1].z = (float)(int)sVar4 * fVar21 + local_d0;
                      sVar4 = *(short *)(lVar2 + 2 + lVar12 * 2);
                      __s[2].x = fVar22 + 1.0;
                      __s[2].y = local_cc;
                      __s[2].z = (float)(int)sVar4 * fVar21 + local_d0;
                      sVar4 = *(short *)(lVar2 + 2 + (local_e0 + uVar16) * 2);
                      __s[3].x = fVar22 + 1.0;
                      __s[3].y = local_11c;
                      __s[3].z = (float)(int)sVar4 * fVar21 + local_d0;
                      if (local_c8->configComputeUVs == true) {
                        __s_00->x = fVar22 * local_104;
                        __s_00->y = local_d8;
                        __s_00->z = 0.0;
                        __s_00[1].x = fVar22 * local_104;
                        __s_00[1].y = local_d4;
                        __s_00[1].z = 0.0;
                        fVar22 = (float)((int)uVar16 + 1) * local_104;
                        __s_00[2].x = fVar22;
                        __s_00[2].y = local_d4;
                        __s_00[2].z = 0.0;
                        __s_00[3].x = fVar22;
                        __s_00[3].y = local_d8;
                        __s_00[3].z = 0.0;
                        __s_00 = __s_00 + 4;
                      }
                      paVar17->mNumIndices = 4;
                      puVar11 = (uint *)operator_new__(0x10);
                      __s = __s + 4;
                      paVar17->mIndices = puVar11;
                      for (lVar12 = 0; lVar12 != 4; lVar12 = lVar12 + 1) {
                        paVar17->mIndices[lVar12] = iVar7 + (int)lVar12;
                      }
                      paVar17 = paVar17 + 1;
                      iVar7 = iVar7 + 4;
                    }
                  }
                  this_00->mNumMeshes = 1;
                  puVar11 = (uint *)operator_new__(4);
                  this_00->mMeshes = puVar11;
                  *puVar11 = 0;
                }
              }
            }
          }
        }
      }
    }
    uVar19 = (int)reader.current - (int)reader.buffer & 3;
    if (uVar19 != 0) {
      StreamReader<false,_false>::IncPtr(&reader,(ulong)(4 - uVar19));
    }
  }
  if (pScene->mNumMeshes != 1) {
    pDVar13 = (DeadlyImportError *)__cxa_allocate_exception(0x10);
    std::__cxx11::string::string((string *)&local_100,"TER: Unable to load terrain",&local_11d);
    DeadlyImportError::DeadlyImportError(pDVar13,&local_100);
    __cxa_throw(pDVar13,&DeadlyImportError::typeinfo,std::runtime_error::~runtime_error);
  }
  *(byte *)&pScene->mFlags = (byte)pScene->mFlags | 0x10;
  StreamReader<false,_false>::~StreamReader(&reader);
  return;
}

Assistant:

void TerragenImporter::InternReadFile( const std::string& pFile,
    aiScene* pScene, IOSystem* pIOHandler)
{
    IOStream* file = pIOHandler->Open( pFile, "rb");

    // Check whether we can read from the file
    if( file == NULL)
        throw DeadlyImportError( "Failed to open TERRAGEN TERRAIN file " + pFile + ".");

    // Construct a stream reader to read all data in the correct endianness
    StreamReaderLE reader(file);
    if(reader.GetRemainingSize() < 16)
        throw DeadlyImportError( "TER: file is too small" );

    // Check for the existence of the two magic strings 'TERRAGEN' and 'TERRAIN '
    if (::strncmp((const char*)reader.GetPtr(),AI_TERR_BASE_STRING,8))
        throw DeadlyImportError( "TER: Magic string \'TERRAGEN\' not found" );

    if (::strncmp((const char*)reader.GetPtr()+8,AI_TERR_TERRAIN_STRING,8))
        throw DeadlyImportError( "TER: Magic string \'TERRAIN\' not found" );

    unsigned int x = 0,y = 0,mode = 0;

    aiNode* root = pScene->mRootNode = new aiNode();
    root->mName.Set("<TERRAGEN.TERRAIN>");

    // Default scaling is 30
    root->mTransformation.a1 = root->mTransformation.b2 = root->mTransformation.c3 = 30.f;

    // Now read all chunks until we're finished or an EOF marker is encountered
    reader.IncPtr(16);
    while (reader.GetRemainingSize() >= 4)
    {
        const char* head = (const char*)reader.GetPtr();
        reader.IncPtr(4);

        // EOF, break in every case
        if (!::strncmp(head,AI_TERR_EOF_STRING,4))
            break;

        // Number of x-data points
        if (!::strncmp(head,AI_TERR_CHUNK_XPTS,4))
        {
            x = (uint16_t)reader.GetI2();
        }
        // Number of y-data points
        else if (!::strncmp(head,AI_TERR_CHUNK_YPTS,4))
        {
            y = (uint16_t)reader.GetI2();
        }
        // Squared terrains width-1.
        else if (!::strncmp(head,AI_TERR_CHUNK_SIZE,4))
        {
            x = y = (uint16_t)reader.GetI2()+1;
        }
        // terrain scaling
        else if (!::strncmp(head,AI_TERR_CHUNK_SCAL,4))
        {
            root->mTransformation.a1 = reader.GetF4();
            root->mTransformation.b2 = reader.GetF4();
            root->mTransformation.c3 = reader.GetF4();
        }
        // mapping == 1: earth radius
        else if (!::strncmp(head,AI_TERR_CHUNK_CRAD,4))
        {
            reader.GetF4();
        }
        // mapping mode
        else if (!::strncmp(head,AI_TERR_CHUNK_CRVM,4))
        {
            mode = reader.GetI1();
            if (0 != mode)
                ASSIMP_LOG_ERROR("TER: Unsupported mapping mode, a flat terrain is returned");
        }
        // actual terrain data
        else if (!::strncmp(head,AI_TERR_CHUNK_ALTW,4))
        {
            float hscale  = (float)reader.GetI2()  / 65536;
            float bheight = (float)reader.GetI2();

            if (!hscale)hscale = 1;

            // Ensure we have enough data
            if (reader.GetRemainingSize() < x*y*2)
                throw DeadlyImportError("TER: ALTW chunk is too small");

            if (x <= 1 || y <= 1)
                throw DeadlyImportError("TER: Invalid terrain size");

            // Allocate the output mesh
            pScene->mMeshes = new aiMesh*[pScene->mNumMeshes = 1];
            aiMesh* m = pScene->mMeshes[0] = new aiMesh();

            // We return quads
            aiFace* f = m->mFaces = new aiFace[m->mNumFaces = (x-1)*(y-1)];
            aiVector3D* pv = m->mVertices = new aiVector3D[m->mNumVertices = m->mNumFaces*4];

            aiVector3D *uv( NULL );
            float step_y( 0.0f ), step_x( 0.0f );
            if (configComputeUVs) {
                uv = m->mTextureCoords[0] = new aiVector3D[m->mNumVertices];
                step_y = 1.f/y;
                step_x = 1.f/x;
            }
            const int16_t* data = (const int16_t*)reader.GetPtr();

            for (unsigned int yy = 0, t = 0; yy < y-1;++yy) {
                for (unsigned int xx = 0; xx < x-1;++xx,++f)    {

                    // make verts
                    const float fy = (float)yy, fx = (float)xx;
                    unsigned tmp,tmp2;
                    *pv++ = aiVector3D(fx,fy,    (float)data[(tmp2=x*yy)    + xx] * hscale + bheight);
                    *pv++ = aiVector3D(fx,fy+1,  (float)data[(tmp=x*(yy+1)) + xx] * hscale + bheight);
                    *pv++ = aiVector3D(fx+1,fy+1,(float)data[tmp  + xx+1]         * hscale + bheight);
                    *pv++ = aiVector3D(fx+1,fy,  (float)data[tmp2 + xx+1]         * hscale + bheight);

                    // also make texture coordinates, if necessary
                    if (configComputeUVs) {
                        *uv++ = aiVector3D( step_x*xx,     step_y*yy,     0.f );
                        *uv++ = aiVector3D( step_x*xx,     step_y*(yy+1), 0.f );
                        *uv++ = aiVector3D( step_x*(xx+1), step_y*(yy+1), 0.f );
                        *uv++ = aiVector3D( step_x*(xx+1), step_y*yy,     0.f );
                    }

                    // make indices
                    f->mIndices = new unsigned int[f->mNumIndices = 4];
                    for (unsigned int i = 0; i < 4;++i)
                        f->mIndices[i] = t++;
                }
            }

            // Add the mesh to the root node
            root->mMeshes = new unsigned int[root->mNumMeshes = 1];
            root->mMeshes[0] = 0;
        }

        // Get to the next chunk (4 byte aligned)
        unsigned dtt;
        if ((dtt = reader.GetCurrentPos() & 0x3))
            reader.IncPtr(4-dtt);
    }

    // Check whether we have a mesh now
    if (pScene->mNumMeshes != 1)
        throw DeadlyImportError("TER: Unable to load terrain");

    // Set the AI_SCENE_FLAGS_TERRAIN bit
    pScene->mFlags |= AI_SCENE_FLAGS_TERRAIN;
}